

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test9::verifyXFBData
          (GPUShaderFP64Test9 *this,_test_case *test_case,uchar *xfb_data)

{
  bool bVar1;
  uint uVar2;
  int *value;
  ostream *poVar3;
  reference pvVar4;
  TestError *this_00;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  _variable_type type_02;
  _variable_type type_03;
  _variable_type type_04;
  _variable_type type_05;
  _variable_type type_06;
  double dVar7;
  MessageBuilder local_f88;
  undefined1 local_e08 [8];
  string variable_type_string_5;
  string operation_type_string_5;
  undefined1 local_c48 [8];
  string variable_type_string_4;
  string operation_type_string_4;
  undefined1 local_a88 [8];
  string variable_type_string_3;
  string operation_type_string_3;
  undefined1 local_8c8 [8];
  string variable_type_string_2;
  string operation_type_string_2;
  undefined1 local_708 [8];
  string variable_type_string_1;
  string operation_type_string_1;
  bool expected_result_gte [2];
  bool expected_result_gt [2];
  bool expected_result_lte [2];
  bool expected_result_lt [2];
  undefined1 local_540 [8];
  string variable_type_string;
  string operation_type_string;
  double expected_value;
  string local_4f0 [4];
  uint n_component_3;
  char *local_4d0;
  MessageBuilder local_4c8;
  uint local_348;
  uint local_344;
  uint n_logged_component_1;
  uint n_logged_component;
  string local_320;
  stringstream local_300 [8];
  stringstream log_sstream;
  ostream local_2f0;
  uint local_174;
  _variable_type local_170;
  uint n_component_2;
  _variable_type matrix_b_type_1;
  _variable_type matrix_a_type_1;
  double expected_result_data [16];
  double local_e0;
  double local_d8;
  uint local_cc;
  double dStack_c8;
  uint n_result_component;
  uint local_bc;
  double dStack_b8;
  uint n_component_1;
  uint local_b0;
  uint local_ac;
  uint n_component;
  uint n_matrix_b_components;
  uint n_matrix_a_components;
  _variable_type local_98;
  _variable_type local_94;
  _variable_type matrix_b_type;
  _variable_type matrix_a_type;
  vector<double,_std::allocator<double>_> reference2;
  vector<double,_std::allocator<double>_> reference1;
  int modifier;
  int *xfb_data_result_gte;
  int *xfb_data_result_gt;
  int *xfb_data_result_lte;
  int *xfb_data_result_lt;
  double *xfb_data_result;
  bool result;
  uint n_result_components;
  double epsilon;
  uchar *xfb_data_local;
  _test_case *test_case_local;
  GPUShaderFP64Test9 *this_local;
  
  uVar2 = Utils::getNumberOfComponentsForVariableType(test_case->result_variable_type);
  xfb_data_result._3_1_ = true;
  value = (int *)(xfb_data + (ulong)uVar2 * 8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&matrix_b_type);
  if ((test_case->operation_type == OPERATION_TYPE_PRE_INCREMENTATION) ||
     (test_case->operation_type == OPERATION_TYPE_POST_INCREMENTATION)) {
    reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else if ((test_case->operation_type == OPERATION_TYPE_PRE_DECREMENTATION) ||
          (test_case->operation_type == OPERATION_TYPE_POST_DECREMENTATION)) {
    reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -1;
  }
  else {
    reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
  bVar1 = Utils::isMatrixVariableType(test_case->variable_type);
  if (bVar1) {
    local_94 = test_case->variable_type;
    local_98 = Utils::getTransposedMatrixVariableType(test_case->variable_type);
    n_component = Utils::getNumberOfComponentsForVariableType(local_94);
    local_ac = Utils::getNumberOfComponentsForVariableType(local_98);
    for (local_b0 = 0; local_b0 < n_component; local_b0 = local_b0 + 1) {
      dStack_b8 = (double)(reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_ + 1 + local_b0);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffff48);
    }
    for (local_bc = 0; local_bc < local_ac; local_bc = local_bc + 1) {
      dStack_c8 = (double)(~local_bc + local_ac);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&matrix_b_type,&stack0xffffffffffffff38)
      ;
    }
  }
  else {
    for (local_cc = 0; local_cc < uVar2; local_cc = local_cc + 1) {
      local_d8 = (double)(reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_ + 1 + local_cc);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_d8);
      local_e0 = (double)(~local_cc + uVar2);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&matrix_b_type,&local_e0);
    }
  }
  if ((test_case->operation_type == OPERATION_TYPE_MULTIPLICATION) &&
     (bVar1 = Utils::isMatrixVariableType(test_case->variable_type), bVar1)) {
    n_component_2 = test_case->variable_type;
    local_170 = Utils::getTransposedMatrixVariableType(test_case->variable_type);
    getMatrixMultiplicationResult
              (this,&n_component_2,
               (vector<double,_std::allocator<double>_> *)
               &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_170,
               (vector<double,_std::allocator<double>_> *)&matrix_b_type,(double *)&matrix_b_type_1)
    ;
    for (local_174 = 0; local_174 < uVar2; local_174 = local_174 + 1) {
      dVar7 = de::abs<double>(*(double *)(xfb_data + (ulong)local_174 * 8) -
                              *(double *)(&matrix_b_type_1 + (ulong)local_174 * 2));
      if (1e-05 < dVar7) {
        std::__cxx11::stringstream::stringstream(local_300);
        poVar3 = std::operator<<(&local_2f0,"Data returned for ");
        Utils::getVariableTypeString_abi_cxx11_(&local_320,(Utils *)(ulong)n_component_2,type);
        poVar3 = std::operator<<(poVar3,(string *)&local_320);
        poVar3 = std::operator<<(poVar3," * ");
        Utils::getVariableTypeString_abi_cxx11_
                  ((string *)&n_logged_component_1,(Utils *)(ulong)local_170,type_00);
        poVar3 = std::operator<<(poVar3,(string *)&n_logged_component_1);
        std::operator<<(poVar3," matrix multiplication was incorrect; expected:(");
        std::__cxx11::string::~string((string *)&n_logged_component_1);
        std::__cxx11::string::~string((string *)&local_320);
        for (local_344 = 0; local_344 < uVar2; local_344 = local_344 + 1) {
          std::ostream::operator<<(&local_2f0,*(double *)(&matrix_b_type_1 + (ulong)local_344 * 2));
          if (local_344 != uVar2 - 1) {
            std::operator<<(&local_2f0,", ");
          }
        }
        std::operator<<(&local_2f0,"), retrieved:(");
        for (local_348 = 0; local_348 < uVar2; local_348 = local_348 + 1) {
          std::ostream::operator<<(&local_2f0,*(double *)(xfb_data + (ulong)local_348 * 8));
          if (local_348 != uVar2 - 1) {
            std::operator<<(&local_2f0,", ");
          }
        }
        std::operator<<(&local_2f0,")");
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        std::__cxx11::stringstream::str();
        local_4d0 = (char *)std::__cxx11::string::c_str();
        pMVar6 = tcu::MessageBuilder::operator<<(&local_4c8,&local_4d0);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string(local_4f0);
        tcu::MessageBuilder::~MessageBuilder(&local_4c8);
        xfb_data_result._3_1_ = false;
        std::__cxx11::stringstream::~stringstream(local_300);
        break;
      }
    }
  }
  else {
    for (expected_value._4_4_ = 0; expected_value._4_4_ < uVar2;
        expected_value._4_4_ = expected_value._4_4_ + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)expected_value._4_4_);
      operation_type_string.field_2._8_8_ = *pvVar4;
      switch(test_case->operation_type) {
      case OPERATION_TYPE_ADDITION:
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&matrix_b_type,
                            (ulong)expected_value._4_4_);
        operation_type_string.field_2._8_8_ =
             (size_type)(*pvVar4 + operation_type_string.field_2._8_8_);
        break;
      case OPERATION_TYPE_DIVISION:
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&matrix_b_type,
                            (ulong)expected_value._4_4_);
        operation_type_string.field_2._8_8_ =
             (size_type)(operation_type_string.field_2._8_8_ / *pvVar4);
        break;
      case OPERATION_TYPE_MULTIPLICATION:
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&matrix_b_type,
                            (ulong)expected_value._4_4_);
        operation_type_string.field_2._8_8_ =
             (size_type)(*pvVar4 * operation_type_string.field_2._8_8_);
        break;
      case OPERATION_TYPE_SUBTRACTION:
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&matrix_b_type,
                            (ulong)expected_value._4_4_);
        operation_type_string.field_2._8_8_ =
             (size_type)(operation_type_string.field_2._8_8_ - *pvVar4);
        break;
      case OPERATION_TYPE_PRE_DECREMENTATION:
      case OPERATION_TYPE_PRE_INCREMENTATION:
        break;
      case OPERATION_TYPE_POST_DECREMENTATION:
      case OPERATION_TYPE_POST_INCREMENTATION:
        operation_type_string.field_2._8_8_ =
             (size_type)
             (operation_type_string.field_2._8_8_ -
             (double)reference1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_);
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized operation type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x2e6e);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar7 = de::abs<double>(*(double *)(xfb_data + (ulong)expected_value._4_4_ * 8) -
                              (double)operation_type_string.field_2._8_8_);
      if (1e-05 < dVar7) {
        getOperationTypeString_abi_cxx11_
                  ((string *)((long)&variable_type_string.field_2 + 8),this,
                   &test_case->operation_type);
        Utils::getVariableTypeString_abi_cxx11_
                  ((string *)local_540,(Utils *)(ulong)test_case->variable_type,type_01);
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)expected_result_gte,pTVar5,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)expected_result_gte,
                            (char (*) [39])"Value(s) generated for variable type [");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_540);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [23])"] and operation type [");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&variable_type_string.field_2 + 8));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"] were found invalid.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)expected_result_gte);
        xfb_data_result._3_1_ = false;
        std::__cxx11::string::~string((string *)local_540);
        std::__cxx11::string::~string((string *)(variable_type_string.field_2._M_local_buf + 8));
        break;
      }
    }
  }
  bVar1 = Utils::isScalarVariableType(test_case->variable_type);
  if (bVar1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[0xe] = dVar7 < *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[0xf] = dVar7 < (double)(float)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[0xc] = dVar7 <= *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[0xd] = dVar7 <= (double)(float)*pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[10] = *pvVar4 <= dVar7 && dVar7 != *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[0xb] = (double)(float)*pvVar4 < dVar7;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[8] = *pvVar4 <= dVar7;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    dVar7 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&matrix_b_type,0);
    operation_type_string_1.field_2._M_local_buf[9] = (double)(float)*pvVar4 <= dVar7;
    if (((*value != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[0xe] & 1U)) ||
       ((value[1] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[0xf] & 1U))) {
      getOperationTypeString_abi_cxx11_
                ((string *)((long)&variable_type_string_1.field_2 + 8),this,
                 &test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)local_708,(Utils *)(ulong)test_case->variable_type,type_02);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)((long)&operation_type_string_2.field_2 + 8),pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)((long)&operation_type_string_2.field_2 + 8),
                          (char (*) [65])
                          "Values reported for lower-than operator used for variable type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_708);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"]and operation type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&variable_type_string_1.field_2 + 8));
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [31])"]was found invalid; expected:(");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xe));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xf));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"); found:(");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)((long)&operation_type_string_2.field_2 + 8));
      xfb_data_result._3_1_ = false;
      std::__cxx11::string::~string((string *)local_708);
      std::__cxx11::string::~string((string *)(variable_type_string_1.field_2._M_local_buf + 8));
    }
    if (((value[2] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[0xc] & 1U)) ||
       ((value[3] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[0xd] & 1U))) {
      getOperationTypeString_abi_cxx11_
                ((string *)((long)&variable_type_string_2.field_2 + 8),this,
                 &test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)local_8c8,(Utils *)(ulong)test_case->variable_type,type_03);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)((long)&operation_type_string_3.field_2 + 8),pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)((long)&operation_type_string_3.field_2 + 8),
                          (char (*) [74])
                          "Values reported for lower-than-or-equal operator used for variable type ["
                         );
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_8c8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"]and operation type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&variable_type_string_2.field_2 + 8));
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [31])"]was found invalid; expected:(");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xe));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xf));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"); found:(");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)((long)&operation_type_string_3.field_2 + 8));
      xfb_data_result._3_1_ = false;
      std::__cxx11::string::~string((string *)local_8c8);
      std::__cxx11::string::~string((string *)(variable_type_string_2.field_2._M_local_buf + 8));
    }
    if (((value[4] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[10] & 1U)) ||
       ((value[5] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[0xb] & 1U))) {
      getOperationTypeString_abi_cxx11_
                ((string *)((long)&variable_type_string_3.field_2 + 8),this,
                 &test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)local_a88,(Utils *)(ulong)test_case->variable_type,type_04);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)((long)&operation_type_string_4.field_2 + 8),pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)((long)&operation_type_string_4.field_2 + 8),
                          (char (*) [67])
                          "Values reported for greater-than operator used for variable type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a88);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"]and operation type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&variable_type_string_3.field_2 + 8));
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [31])"]was found invalid; expected:(");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xe));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xf));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"); found:(");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)((long)&operation_type_string_4.field_2 + 8));
      xfb_data_result._3_1_ = false;
      std::__cxx11::string::~string((string *)local_a88);
      std::__cxx11::string::~string((string *)(variable_type_string_3.field_2._M_local_buf + 8));
    }
    if (((value[6] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[8] & 1U)) ||
       ((value[7] != 0) != (bool)(operation_type_string_1.field_2._M_local_buf[9] & 1U))) {
      getOperationTypeString_abi_cxx11_
                ((string *)((long)&variable_type_string_4.field_2 + 8),this,
                 &test_case->operation_type);
      Utils::getVariableTypeString_abi_cxx11_
                ((string *)local_c48,(Utils *)(ulong)test_case->variable_type,type_05);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)((long)&operation_type_string_5.field_2 + 8),pTVar5,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)((long)&operation_type_string_5.field_2 + 8),
                          (char (*) [76])
                          "Values reported for greater-than-or-equal operator used for variable type ["
                         );
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_c48);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"]and operation type [");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&variable_type_string_4.field_2 + 8));
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [31])"]was found invalid; expected:(");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xe));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(bool *)(operation_type_string_1.field_2._M_local_buf + 0xf));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"); found:(");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a4b1eb);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c23dab);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)((long)&operation_type_string_5.field_2 + 8));
      xfb_data_result._3_1_ = false;
      std::__cxx11::string::~string((string *)local_c48);
      std::__cxx11::string::~string((string *)(variable_type_string_4.field_2._M_local_buf + 8));
    }
  }
  else if (((((*value != 1) || (value[1] != 1)) || (value[2] != 1)) ||
           ((value[3] != 1 || (value[4] != 1)))) ||
          ((value[5] != 1 || ((value[6] != 1 || (value[7] != 1)))))) {
    getOperationTypeString_abi_cxx11_
              ((string *)((long)&variable_type_string_5.field_2 + 8),this,&test_case->operation_type
              );
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)local_e08,(Utils *)(ulong)test_case->variable_type,type_06);
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_f88,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_f88,
                        (char (*) [114])
                        "Invalid value was reported for matrix variable type, for which  operator checks are not executed; variable type ["
                       );
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e08);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])"]and operation type [");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&variable_type_string_5.field_2 + 8));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_f88);
    xfb_data_result._3_1_ = false;
    std::__cxx11::string::~string((string *)local_e08);
    std::__cxx11::string::~string((string *)(variable_type_string_5.field_2._M_local_buf + 8));
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&matrix_b_type);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &reference2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return xfb_data_result._3_1_;
}

Assistant:

bool GPUShaderFP64Test9::verifyXFBData(const _test_case& test_case, const unsigned char* xfb_data)
{
	const double	   epsilon = 1e-5;
	const unsigned int n_result_components =
		Utils::getNumberOfComponentsForVariableType(test_case.result_variable_type);
	bool		  result			  = true;
	const double* xfb_data_result	 = (const double*)xfb_data;
	const int*	xfb_data_result_lt  = (const int*)(xfb_data_result + n_result_components);
	const int*	xfb_data_result_lte = (const int*)xfb_data_result_lt + 2;  /* cast/non-cast cases */
	const int*	xfb_data_result_gt  = (const int*)xfb_data_result_lte + 2; /* cast/non-cast cases */
	const int*	xfb_data_result_gte = (const int*)xfb_data_result_gt + 2;  /* cast/non-cast cases */

	/* Prepare reference values */
	int					modifier;
	std::vector<double> reference1;
	std::vector<double> reference2;

	if (test_case.operation_type == OPERATION_TYPE_PRE_INCREMENTATION ||
		test_case.operation_type == OPERATION_TYPE_POST_INCREMENTATION)
	{
		modifier = 1;
	}
	else if (test_case.operation_type == OPERATION_TYPE_PRE_DECREMENTATION ||
			 test_case.operation_type == OPERATION_TYPE_POST_DECREMENTATION)
	{
		modifier = -1;
	}
	else
	{
		modifier = 0;
	}

	if (Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrices may be of different sizes so we need to compute the
		 * reference values separately for each matrix
		 */
		const Utils::_variable_type matrix_a_type = test_case.variable_type;
		const Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);
		const unsigned int			n_matrix_a_components = Utils::getNumberOfComponentsForVariableType(matrix_a_type);
		const unsigned int			n_matrix_b_components = Utils::getNumberOfComponentsForVariableType(matrix_b_type);

		for (unsigned int n_component = 0; n_component < n_matrix_a_components; ++n_component)
		{
			reference1.push_back(modifier + n_component + 1);
		}

		for (unsigned int n_component = 0; n_component < n_matrix_b_components; ++n_component)
		{
			reference2.push_back(n_matrix_b_components - (n_component + 1));
		}
	} /* if (Utils::isMatrixVariableType(test_case.variable_type) */
	else
	{
		/* Generate as many components as will be expected for the result variable */
		for (unsigned int n_result_component = 0; n_result_component < n_result_components; ++n_result_component)
		{
			reference1.push_back(modifier + n_result_component + 1);
			reference2.push_back(n_result_components - (n_result_component + 1));
		}
	}

	/* Verify the result value(s) */
	if (test_case.operation_type == OPERATION_TYPE_MULTIPLICATION &&
		Utils::isMatrixVariableType(test_case.variable_type))
	{
		/* Matrix multiplication */
		double				  expected_result_data[4 * 4];
		Utils::_variable_type matrix_a_type = test_case.variable_type;
		Utils::_variable_type matrix_b_type = Utils::getTransposedMatrixVariableType(test_case.variable_type);

		getMatrixMultiplicationResult(matrix_a_type, reference1, matrix_b_type, reference2, expected_result_data);

		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			if (de::abs(xfb_data_result[n_component] - expected_result_data[n_component]) > epsilon)
			{
				std::stringstream log_sstream;

				log_sstream << "Data returned for " << Utils::getVariableTypeString(matrix_a_type) << " * "
							<< Utils::getVariableTypeString(matrix_b_type)
							<< " matrix multiplication was incorrect; expected:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << expected_result_data[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << "), retrieved:(";

				for (unsigned int n_logged_component = 0; n_logged_component < n_result_components;
					 ++n_logged_component)
				{
					log_sstream << xfb_data_result[n_logged_component];

					if (n_logged_component != (n_result_components - 1))
					{
						log_sstream << ", ";
					}
				} /* for (all components to be logged) */

				log_sstream << ")";

				m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		} /* for (all result components) */
	}	 /* if (dealing with matrix multiplication) */
	else
	{
		for (unsigned int n_component = 0; n_component < n_result_components; ++n_component)
		{
			double expected_value = reference1[n_component];

			switch (test_case.operation_type)
			{
			case OPERATION_TYPE_ADDITION:
				expected_value += reference2[n_component];
				break;
			case OPERATION_TYPE_DIVISION:
				expected_value /= reference2[n_component];
				break;
			case OPERATION_TYPE_MULTIPLICATION:
				expected_value *= reference2[n_component];
				break;
			case OPERATION_TYPE_SUBTRACTION:
				expected_value -= reference2[n_component];
				break;

			case OPERATION_TYPE_PRE_DECREMENTATION:
			case OPERATION_TYPE_PRE_INCREMENTATION:
			{
				/* Modifier already applied */
				break;
			}

			case OPERATION_TYPE_POST_DECREMENTATION:
			case OPERATION_TYPE_POST_INCREMENTATION:
			{
				/* Need to reverse the modification for the purpose of the following check */
				expected_value -= modifier;

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized operation type");
			}
			} /* switch (test_case.operation_type) */

			if (de::abs(xfb_data_result[n_component] - expected_value) > epsilon)
			{
				std::string operation_type_string = getOperationTypeString(test_case.operation_type);
				std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

				m_testCtx.getLog() << tcu::TestLog::Message << "Value(s) generated for variable type ["
								   << variable_type_string << "]"
															  " and operation type ["
								   << operation_type_string << "]"
															   " were found invalid."
								   << tcu::TestLog::EndMessage;

				result = false;
				break;
			} /* if (test case failed) */
		}	 /* for (all components) */
	}

	/* Verify the comparison operation results */
	if (Utils::isScalarVariableType(test_case.variable_type))
	{
		DE_ASSERT(n_result_components == 1);

		const bool expected_result_lt[2]  = { reference1[0] < reference2[0], reference1[0] < (float)reference2[0] };
		const bool expected_result_lte[2] = { reference1[0] <= reference2[0], reference1[0] <= (float)reference2[0] };
		const bool expected_result_gt[2]  = { reference1[0] > reference2[0], reference1[0] > (float)reference2[0] };
		const bool expected_result_gte[2] = { reference1[0] >= reference2[0], reference1[0] >= (float)reference2[0] };

		if ((xfb_data_result_lt[0] ? 1 : 0) != expected_result_lt[0] ||
			(xfb_data_result_lt[1] ? 1 : 0) != expected_result_lt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_lte[0] ? 1 : 0) != expected_result_lte[0] ||
			(xfb_data_result_lte[1] ? 1 : 0) != expected_result_lte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for lower-than-or-equal operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gt[0] ? 1 : 0) != expected_result_gt[0] ||
			(xfb_data_result_gt[1] ? 1 : 0) != expected_result_gt[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for greater-than operator used for "
														   "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		if ((xfb_data_result_gte[0] ? 1 : 0) != expected_result_gte[0] ||
			(xfb_data_result_gte[1] ? 1 : 0) != expected_result_gte[1])
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Values reported for greater-than-or-equal operator used for "
								  "variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]"
														   "was found invalid; expected:("
							   << expected_result_lt[0] << ", " << expected_result_lt[1] << "); found:("
							   << xfb_data_result_lt[0] << ", " << xfb_data_result_lt[1] << ")."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* if (Utils::isScalarVariableType(test_case.variable_type) ) */
	else
	{
		if (xfb_data_result_lt[0] != 1 || xfb_data_result_lt[1] != 1 || xfb_data_result_lte[0] != 1 ||
			xfb_data_result_lte[1] != 1 || xfb_data_result_gt[0] != 1 || xfb_data_result_gt[1] != 1 ||
			xfb_data_result_gte[0] != 1 || xfb_data_result_gte[1] != 1)
		{
			std::string operation_type_string = getOperationTypeString(test_case.operation_type);
			std::string variable_type_string  = Utils::getVariableTypeString(test_case.variable_type);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid value was reported for matrix variable type, for which "
								  " operator checks are not executed; variable type ["
							   << variable_type_string << "]"
														  "and operation type ["
							   << operation_type_string << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}